

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O3

ssize_t __thiscall DomLayoutFunction::write(DomLayoutFunction *this,int __fd,void *__buf,size_t __n)

{
  QArrayData *pQVar1;
  char16_t *pcVar2;
  undefined4 in_register_00000034;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 aVar3;
  long in_FS_OFFSET;
  QAnyStringView QVar4;
  QAnyStringView QVar5;
  QAnyStringView QVar6;
  QAnyStringView QVar7;
  QAnyStringView QVar8;
  QAnyStringView QVar9;
  QAnyStringView QVar10;
  QAnyStringView QVar11;
  QAnyStringView QVar12;
  QString local_40;
  long local_28;
  
  aVar3._4_4_ = in_register_00000034;
  aVar3._0_4_ = __fd;
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(long *)((long)__buf + 0x10) == 0) {
    local_40.d.d = (Data *)0x0;
    local_40.d.ptr = L"layoutfunction";
    local_40.d.size = 0xe;
  }
  else {
    QString::toLower_helper(&local_40);
  }
  QVar8.m_size = (size_t)local_40.d.ptr;
  QVar8.field_0.m_data = aVar3.m_data;
  QXmlStreamWriter::writeStartElement(QVar8);
  if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (this->m_has_attr_spacing == true) {
    pQVar1 = &((this->m_attr_spacing).d.d)->super_QArrayData;
    pcVar2 = (this->m_attr_spacing).d.ptr;
    if (pQVar1 == (QArrayData *)0x0) {
      QVar5.m_size = (size_t)pcVar2;
      QVar5.field_0 = (anon_union_8_3_8ad491a7_for_QAnyStringView_6)(void *)0x8000000000000007;
      QVar10.m_size = (size_t)L"spacing";
      QVar10.field_0.m_data = aVar3.m_data;
      QXmlStreamWriter::writeAttribute(QVar10,QVar5);
    }
    else {
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      QVar4.m_size = (size_t)pcVar2;
      QVar4.field_0 = (anon_union_8_3_8ad491a7_for_QAnyStringView_6)(void *)0x8000000000000007;
      QVar9.m_size = (size_t)L"spacing";
      QVar9.field_0.m_data = aVar3.m_data;
      QXmlStreamWriter::writeAttribute(QVar9,QVar4);
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar1,2,0x10);
      }
    }
  }
  if (this->m_has_attr_margin == true) {
    pQVar1 = &((this->m_attr_margin).d.d)->super_QArrayData;
    pcVar2 = (this->m_attr_margin).d.ptr;
    if (pQVar1 == (QArrayData *)0x0) {
      QVar7.m_size = (size_t)pcVar2;
      QVar7.field_0.m_data = (void *)0x8000000000000006;
      QVar12.m_size = (size_t)L"margin";
      QVar12.field_0.m_data = aVar3.m_data;
      QXmlStreamWriter::writeAttribute(QVar12,QVar7);
    }
    else {
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      QVar6.m_size = (size_t)pcVar2;
      QVar6.field_0.m_data = (void *)0x8000000000000006;
      QVar11.m_size = (size_t)L"margin";
      QVar11.field_0.m_data = aVar3.m_data;
      QXmlStreamWriter::writeAttribute(QVar11,QVar6);
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar1,2,0x10);
      }
    }
  }
  QXmlStreamWriter::writeEndElement();
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return *(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void DomLayoutFunction::write(QXmlStreamWriter &writer, const QString &tagName) const
{
    writer.writeStartElement(tagName.isEmpty() ? QStringLiteral("layoutfunction") : tagName.toLower());

    if (hasAttributeSpacing())
        writer.writeAttribute(u"spacing"_s, attributeSpacing());

    if (hasAttributeMargin())
        writer.writeAttribute(u"margin"_s, attributeMargin());

    writer.writeEndElement();
}